

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O0

void __thiscall
chrono::ChArchiveExplorer::out_array_end(ChArchiveExplorer *this,ChValue *bVal,size_t msize)

{
  bool bVar1;
  reference local_30;
  size_t local_20;
  size_t msize_local;
  ChValue *bVal_local;
  ChArchiveExplorer *this_local;
  
  local_20 = msize;
  msize_local = (size_t)bVal;
  bVal_local = (ChValue *)this;
  local_30 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&this->in_array,(long)this->tablevel);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_30);
  if (bVar1) {
    this->tablevel = this->tablevel + -1;
    std::vector<bool,_std::allocator<bool>_>::pop_back(&this->in_array);
  }
  return;
}

Assistant:

virtual void out_array_end (ChValue& bVal, size_t msize) {
            if (in_array[tablevel] == true) {
                --tablevel; 
                in_array.pop_back();
            }
      }